

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O1

void writesf_stop(t_writesf *x)

{
  pthread_mutex_lock((pthread_mutex_t *)&x->x_mutex);
  x->x_state = STATE_IDLE;
  x->x_requestcode = REQUEST_CLOSE;
  pthread_cond_signal((pthread_cond_t *)&x->x_requestcondition);
  pthread_mutex_unlock((pthread_mutex_t *)&x->x_mutex);
  return;
}

Assistant:

static void writesf_stop(t_writesf *x)
{
    pthread_mutex_lock(&x->x_mutex);
    x->x_state = STATE_IDLE;
    x->x_requestcode = REQUEST_CLOSE;
#ifdef DEBUG_SOUNDFILE_THREADS
    fprintf(stderr, "writesf~: signal 2\n");
#endif
    sfread_cond_signal(&x->x_requestcondition);
    pthread_mutex_unlock(&x->x_mutex);
}